

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O0

vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *
vk::wsi::getPhysicalDeviceSurfaceFormats
          (vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice,
          VkSurfaceKHR surface)

{
  VkPhysicalDevice pVVar1;
  VkPhysicalDevice pVVar2;
  InstanceInterface *pIVar3;
  VkResult VVar4;
  ulong __n;
  reference pvVar5;
  allocator<vk::VkSurfaceFormatKHR> local_3a;
  undefined1 local_39;
  deUint64 local_38;
  uint local_2c;
  VkPhysicalDevice pVStack_28;
  deUint32 numFormats;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  VkSurfaceKHR surface_local;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *formats;
  
  local_2c = 0;
  local_38 = surface.m_internal;
  pVStack_28 = physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vki;
  vki_local = (InstanceInterface *)surface.m_internal;
  surface_local.m_internal = (deUint64)__return_storage_ptr__;
  VVar4 = (*vki->_vptr_InstanceInterface[0x10])(vki,physicalDevice,surface.m_internal,&local_2c,0);
  checkResult(VVar4,
              "vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, DE_NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
              ,0x117);
  if (local_2c == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::vector
              (__return_storage_ptr__);
  }
  else {
    local_39 = 0;
    __n = (ulong)local_2c;
    std::allocator<vk::VkSurfaceFormatKHR>::allocator(&local_3a);
    std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::vector
              (__return_storage_ptr__,__n,&local_3a);
    std::allocator<vk::VkSurfaceFormatKHR>::~allocator(&local_3a);
    pIVar3 = vki_local;
    pVVar2 = physicalDevice_local;
    pVVar1 = pVStack_28;
    pvVar5 = std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::
             operator[](__return_storage_ptr__,0);
    VVar4 = (**(code **)(*(long *)pVVar2 + 0x80))(pVVar2,pVVar1,pIVar3,&local_2c,pvVar5);
    checkResult(VVar4,
                "vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, &formats[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
                ,0x11d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkSurfaceFormatKHR> getPhysicalDeviceSurfaceFormats (const InstanceInterface&		vki,
																 VkPhysicalDevice				physicalDevice,
																 VkSurfaceKHR					surface)
{
	deUint32	numFormats	= 0;

	VK_CHECK(vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, DE_NULL));

	if (numFormats > 0)
	{
		std::vector<VkSurfaceFormatKHR>	formats	(numFormats);

		VK_CHECK(vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, &formats[0]));

		return formats;
	}
	else
		return std::vector<VkSurfaceFormatKHR>();
}